

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filemgr.cc
# Opt level: O0

uint64_t filemgr_update_header(filemgr *file,void *buf,size_t len,bool inc_revnum)

{
  uint64_t uVar1;
  void *pvVar2;
  byte in_CL;
  size_t in_RDX;
  void *in_RSI;
  long in_RDI;
  uint64_t ret;
  
  pthread_spin_lock((pthread_spinlock_t *)(in_RDI + 0x1a0));
  if (*(long *)(in_RDI + 0xe0) == 0) {
    pvVar2 = malloc((ulong)*(uint *)(in_RDI + 0x10));
    *(void **)(in_RDI + 0xe0) = pvVar2;
  }
  memcpy(*(void **)(in_RDI + 0xe0),in_RSI,in_RDX);
  *(short *)(in_RDI + 0x50) = (short)in_RDX;
  if ((in_CL & 1) != 0) {
    *(long *)(in_RDI + 0x58) = *(long *)(in_RDI + 0x58) + 1;
  }
  uVar1 = *(uint64_t *)(in_RDI + 0x58);
  pthread_spin_unlock((pthread_spinlock_t *)(in_RDI + 0x1a0));
  return uVar1;
}

Assistant:

uint64_t filemgr_update_header(struct filemgr *file,
                               void *buf,
                               size_t len,
                               bool inc_revnum)
{
    uint64_t ret;

    spin_lock(&file->lock);

    if (file->header.data == NULL) {
        file->header.data = (void *)malloc(file->blocksize);
    }
    memcpy(file->header.data, buf, len);
    file->header.size = len;
    if (inc_revnum) {
        ++(file->header.revnum);
    }
    ret = file->header.revnum;

    spin_unlock(&file->lock);

    return ret;
}